

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_DeletePropertyScoped
              (FrameDisplay *pScope,PropertyId propertyId,Var defaultInstance,
              ScriptContext *scriptContext,PropertyOperationFlags propertyOperationFlags)

{
  uint16 uVar1;
  BOOL BVar2;
  RecyclableObject *pRVar3;
  JavascriptLibrary *this;
  JavascriptBoolean *pJVar4;
  Var pvVar5;
  DynamicObject *obj;
  uint local_38;
  int length;
  int i;
  PropertyOperationFlags propertyOperationFlags_local;
  ScriptContext *scriptContext_local;
  Var defaultInstance_local;
  PropertyId propertyId_local;
  FrameDisplay *pScope_local;
  
  uVar1 = FrameDisplay::GetLength(pScope);
  local_38 = 0;
  while( true ) {
    if ((int)(uint)uVar1 <= (int)local_38) {
      pRVar3 = VarTo<Js::RecyclableObject>(defaultInstance);
      pvVar5 = OP_DeleteRootProperty(pRVar3,propertyId,scriptContext,propertyOperationFlags);
      return pvVar5;
    }
    pRVar3 = (RecyclableObject *)FrameDisplay::GetItem(pScope,local_38);
    BVar2 = HasProperty(pRVar3,propertyId);
    if (BVar2 != 0) break;
    local_38 = local_38 + 1;
  }
  this = ScriptContext::GetLibrary(scriptContext);
  BVar2 = DeleteProperty(pRVar3,propertyId,propertyOperationFlags);
  pJVar4 = JavascriptLibrary::CreateBoolean(this,BVar2);
  return pJVar4;
}

Assistant:

Var JavascriptOperators::OP_DeletePropertyScoped(
        FrameDisplay *pScope,
        PropertyId propertyId,
        Var defaultInstance,
        ScriptContext* scriptContext,
        PropertyOperationFlags propertyOperationFlags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_DeletePropertyScoped);
        JIT_HELPER_SAME_ATTRIBUTES(Op_DeleteRootProperty, Op_DeletePropertyScoped);
        int i;
        int length = pScope->GetLength();

        for (i = 0; i < length; i++)
        {
            DynamicObject *obj = (DynamicObject*)pScope->GetItem(i);
            if (JavascriptOperators::HasProperty(obj, propertyId))
            {
                return scriptContext->GetLibrary()->CreateBoolean(JavascriptOperators::DeleteProperty(obj, propertyId, propertyOperationFlags));
            }
        }

        return JavascriptOperators::OP_DeleteRootProperty(VarTo<RecyclableObject>(defaultInstance), propertyId, scriptContext, propertyOperationFlags);
        JIT_HELPER_END(Op_DeletePropertyScoped);
    }